

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalMap.c
# Opt level: O2

Gia_Man_t *
Gia_ManPerformSopBalanceWin
          (Gia_Man_t *p,int LevelMax,int nTimeWindow,int nCutNum,int nRelaxRatio,int fVerbose)

{
  uint uVar1;
  Vec_Int_t *p_00;
  Gia_Man_t *pGVar2;
  Gia_Man_t *pWin;
  
  if ((LevelMax == 0) != (nTimeWindow != 0)) {
    __assert_fail("!LevelMax != !nTimeWindow",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaBalMap.c"
                  ,0x10d,
                  "Gia_Man_t *Gia_ManPerformSopBalanceWin(Gia_Man_t *, int, int, int, int, int)");
  }
  p_00 = Gia_ManFindLatest(p,LevelMax,nTimeWindow);
  uVar1 = p_00->nSize;
  if (fVerbose != 0) {
    printf("Collected %d outputs to extract.\n",(ulong)uVar1);
  }
  if (uVar1 != 0) {
    pGVar2 = Gia_ManExtractWin(p,p_00,0);
    pWin = Gia_ManPerformSopBalance(pGVar2,nCutNum,nRelaxRatio,fVerbose);
    Gia_ManStop(pGVar2);
    pGVar2 = Gia_ManInsertWin(p,p_00,pWin);
    Gia_ManStop(pWin);
    Vec_IntFree(p_00);
    return pGVar2;
  }
  Vec_IntFree(p_00);
  pGVar2 = Gia_ManDup(p);
  return pGVar2;
}

Assistant:

Gia_Man_t * Gia_ManPerformSopBalanceWin( Gia_Man_t * p, int LevelMax, int nTimeWindow, int nCutNum, int nRelaxRatio, int fVerbose )
{
    Vec_Int_t * vOuts;
    Gia_Man_t * pNew, * pWin, * pWinNew;
    assert( !LevelMax != !nTimeWindow );
    vOuts = Gia_ManFindLatest( p, LevelMax, nTimeWindow );
    if ( fVerbose )
        printf( "Collected %d outputs to extract.\n", Vec_IntSize(vOuts) );
    if ( Vec_IntSize(vOuts) == 0 )
    {
        Vec_IntFree( vOuts );
        return Gia_ManDup( p );
    }
    pWin = Gia_ManExtractWin( p, vOuts, 0 );
    pWinNew = Gia_ManPerformSopBalance( pWin, nCutNum, nRelaxRatio, fVerbose );
    Gia_ManStop( pWin );
    pNew = Gia_ManInsertWin( p, vOuts, pWinNew );
    Gia_ManStop( pWinNew );
    Vec_IntFree( vOuts );
    return pNew;
}